

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_debug_slice_header(h264_stream_t *h,bs_t *b)

{
  slice_header_t *__s;
  nal_t *pnVar1;
  pps_t *ppVar2;
  sps_t *psVar3;
  uint32_t uVar4;
  int32_t iVar5;
  int iVar6;
  FILE *local_1d0;
  FILE *local_1c8;
  FILE *local_1c0;
  FILE *local_1b8;
  FILE *local_1b0;
  FILE *local_1a8;
  FILE *local_1a0;
  FILE *local_198;
  FILE *local_190;
  FILE *local_188;
  FILE *local_180;
  FILE *local_178;
  FILE *local_170;
  FILE *local_168;
  FILE *local_160;
  FILE *local_158;
  FILE *local_150;
  FILE *local_148;
  FILE *local_140;
  FILE *local_138;
  FILE *local_130;
  FILE *local_128;
  FILE *local_120;
  FILE *local_118;
  FILE *local_110;
  FILE *local_108;
  FILE *local_100;
  FILE *local_f8;
  FILE *local_f0;
  FILE *local_e8;
  FILE *local_e0;
  FILE *local_d8;
  FILE *local_d0;
  FILE *local_c8;
  FILE *local_c0;
  FILE *local_b8;
  FILE *local_b0;
  FILE *local_a8;
  FILE *local_a0;
  FILE *local_98;
  FILE *local_90;
  FILE *local_88;
  FILE *local_80;
  FILE *local_78;
  FILE *local_70;
  FILE *local_68;
  FILE *local_60;
  FILE *local_58;
  FILE *local_50;
  FILE *local_48;
  int v;
  sps_t *sps;
  pps_t *pps;
  nal_t *nal;
  slice_header_t *sh;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  __s = h->sh;
  memset(__s,0,0x1b80);
  pnVar1 = h->nal;
  if (h264_dbgfile == (FILE *)0x0) {
    local_48 = _stdout;
  }
  else {
    local_48 = (FILE *)h264_dbgfile;
  }
  fprintf(local_48,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_ue(b);
  __s->first_mb_in_slice = uVar4;
  if (h264_dbgfile == (FILE *)0x0) {
    local_50 = _stdout;
  }
  else {
    local_50 = (FILE *)h264_dbgfile;
  }
  fprintf(local_50,"sh->first_mb_in_slice: %d \n",(ulong)(uint)__s->first_mb_in_slice);
  if (h264_dbgfile == (FILE *)0x0) {
    local_58 = _stdout;
  }
  else {
    local_58 = (FILE *)h264_dbgfile;
  }
  fprintf(local_58,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_ue(b);
  __s->slice_type = uVar4;
  if (h264_dbgfile == (FILE *)0x0) {
    local_60 = _stdout;
  }
  else {
    local_60 = (FILE *)h264_dbgfile;
  }
  fprintf(local_60,"sh->slice_type: %d \n",(ulong)(uint)__s->slice_type);
  if (h264_dbgfile == (FILE *)0x0) {
    local_68 = _stdout;
  }
  else {
    local_68 = (FILE *)h264_dbgfile;
  }
  fprintf(local_68,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_ue(b);
  __s->pic_parameter_set_id = uVar4;
  if (h264_dbgfile == (FILE *)0x0) {
    local_70 = _stdout;
  }
  else {
    local_70 = (FILE *)h264_dbgfile;
  }
  fprintf(local_70,"sh->pic_parameter_set_id: %d \n",(ulong)(uint)__s->pic_parameter_set_id);
  ppVar2 = h->pps;
  psVar3 = h->sps;
  memcpy(h->pps,h->pps_table[__s->pic_parameter_set_id],0x87c);
  memcpy(h->sps,h->sps_table[ppVar2->seq_parameter_set_id],0x1028);
  if (psVar3->residual_colour_transform_flag != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_78 = _stdout;
    }
    else {
      local_78 = (FILE *)h264_dbgfile;
    }
    fprintf(local_78,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_u(b,2);
    __s->colour_plane_id = uVar4;
    if (h264_dbgfile == (FILE *)0x0) {
      local_80 = _stdout;
    }
    else {
      local_80 = (FILE *)h264_dbgfile;
    }
    fprintf(local_80,"sh->colour_plane_id: %d \n",(ulong)(uint)__s->colour_plane_id);
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_88 = _stdout;
  }
  else {
    local_88 = (FILE *)h264_dbgfile;
  }
  fprintf(local_88,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_u(b,psVar3->log2_max_frame_num_minus4 + 4);
  __s->frame_num = uVar4;
  if (h264_dbgfile == (FILE *)0x0) {
    local_90 = _stdout;
  }
  else {
    local_90 = (FILE *)h264_dbgfile;
  }
  fprintf(local_90,"sh->frame_num: %d \n",(ulong)(uint)__s->frame_num);
  if (psVar3->frame_mbs_only_flag == 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_98 = _stdout;
    }
    else {
      local_98 = (FILE *)h264_dbgfile;
    }
    fprintf(local_98,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_u1(b);
    __s->field_pic_flag = uVar4;
    if (h264_dbgfile == (FILE *)0x0) {
      local_a0 = _stdout;
    }
    else {
      local_a0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_a0,"sh->field_pic_flag: %d \n",(ulong)(uint)__s->field_pic_flag);
    if (__s->field_pic_flag != 0) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_a8 = _stdout;
      }
      else {
        local_a8 = (FILE *)h264_dbgfile;
      }
      fprintf(local_a8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar4 = bs_read_u1(b);
      __s->bottom_field_flag = uVar4;
      if (h264_dbgfile == (FILE *)0x0) {
        local_b0 = _stdout;
      }
      else {
        local_b0 = (FILE *)h264_dbgfile;
      }
      fprintf(local_b0,"sh->bottom_field_flag: %d \n",(ulong)(uint)__s->bottom_field_flag);
    }
  }
  if (pnVar1->nal_unit_type == 5) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_b8 = _stdout;
    }
    else {
      local_b8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_b8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    __s->idr_pic_id = uVar4;
    if (h264_dbgfile == (FILE *)0x0) {
      local_c0 = _stdout;
    }
    else {
      local_c0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_c0,"sh->idr_pic_id: %d \n",(ulong)(uint)__s->idr_pic_id);
  }
  if (psVar3->pic_order_cnt_type == 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_c8 = _stdout;
    }
    else {
      local_c8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_c8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_u(b,psVar3->log2_max_pic_order_cnt_lsb_minus4 + 4);
    __s->pic_order_cnt_lsb = uVar4;
    if (h264_dbgfile == (FILE *)0x0) {
      local_d0 = _stdout;
    }
    else {
      local_d0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_d0,"sh->pic_order_cnt_lsb: %d \n",(ulong)(uint)__s->pic_order_cnt_lsb);
    if ((ppVar2->pic_order_present_flag != 0) && (__s->field_pic_flag == 0)) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_d8 = _stdout;
      }
      else {
        local_d8 = (FILE *)h264_dbgfile;
      }
      fprintf(local_d8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      iVar5 = bs_read_se(b);
      __s->delta_pic_order_cnt_bottom = iVar5;
      if (h264_dbgfile == (FILE *)0x0) {
        local_e0 = _stdout;
      }
      else {
        local_e0 = (FILE *)h264_dbgfile;
      }
      fprintf(local_e0,"sh->delta_pic_order_cnt_bottom: %d \n",
              (ulong)(uint)__s->delta_pic_order_cnt_bottom);
    }
  }
  if ((psVar3->pic_order_cnt_type == 1) && (psVar3->delta_pic_order_always_zero_flag == 0)) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_e8 = _stdout;
    }
    else {
      local_e8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_e8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    iVar5 = bs_read_se(b);
    __s->delta_pic_order_cnt[0] = iVar5;
    if (h264_dbgfile == (FILE *)0x0) {
      local_f0 = _stdout;
    }
    else {
      local_f0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_f0,"sh->delta_pic_order_cnt[ 0 ]: %d \n",(ulong)(uint)__s->delta_pic_order_cnt[0])
    ;
    if ((ppVar2->pic_order_present_flag != 0) && (__s->field_pic_flag == 0)) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_f8 = _stdout;
      }
      else {
        local_f8 = (FILE *)h264_dbgfile;
      }
      fprintf(local_f8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      iVar5 = bs_read_se(b);
      __s->delta_pic_order_cnt[1] = iVar5;
      if (h264_dbgfile == (FILE *)0x0) {
        local_100 = _stdout;
      }
      else {
        local_100 = (FILE *)h264_dbgfile;
      }
      fprintf(local_100,"sh->delta_pic_order_cnt[ 1 ]: %d \n",
              (ulong)(uint)__s->delta_pic_order_cnt[1]);
    }
  }
  if (ppVar2->redundant_pic_cnt_present_flag != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_108 = _stdout;
    }
    else {
      local_108 = (FILE *)h264_dbgfile;
    }
    fprintf(local_108,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    __s->redundant_pic_cnt = uVar4;
    if (h264_dbgfile == (FILE *)0x0) {
      local_110 = _stdout;
    }
    else {
      local_110 = (FILE *)h264_dbgfile;
    }
    fprintf(local_110,"sh->redundant_pic_cnt: %d \n",(ulong)(uint)__s->redundant_pic_cnt);
  }
  iVar6 = is_slice_type(__s->slice_type,1);
  if (iVar6 != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_118 = _stdout;
    }
    else {
      local_118 = (FILE *)h264_dbgfile;
    }
    fprintf(local_118,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_u1(b);
    __s->direct_spatial_mv_pred_flag = uVar4;
    if (h264_dbgfile == (FILE *)0x0) {
      local_120 = _stdout;
    }
    else {
      local_120 = (FILE *)h264_dbgfile;
    }
    fprintf(local_120,"sh->direct_spatial_mv_pred_flag: %d \n",
            (ulong)(uint)__s->direct_spatial_mv_pred_flag);
  }
  iVar6 = is_slice_type(__s->slice_type,0);
  if (((iVar6 != 0) || (iVar6 = is_slice_type(__s->slice_type,3), iVar6 != 0)) ||
     (iVar6 = is_slice_type(__s->slice_type,1), iVar6 != 0)) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_128 = _stdout;
    }
    else {
      local_128 = (FILE *)h264_dbgfile;
    }
    fprintf(local_128,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_u1(b);
    __s->num_ref_idx_active_override_flag = uVar4;
    if (h264_dbgfile == (FILE *)0x0) {
      local_130 = _stdout;
    }
    else {
      local_130 = (FILE *)h264_dbgfile;
    }
    fprintf(local_130,"sh->num_ref_idx_active_override_flag: %d \n",
            (ulong)(uint)__s->num_ref_idx_active_override_flag);
    if (__s->num_ref_idx_active_override_flag != 0) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_138 = _stdout;
      }
      else {
        local_138 = (FILE *)h264_dbgfile;
      }
      fprintf(local_138,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar4 = bs_read_ue(b);
      __s->num_ref_idx_l0_active_minus1 = uVar4;
      if (h264_dbgfile == (FILE *)0x0) {
        local_140 = _stdout;
      }
      else {
        local_140 = (FILE *)h264_dbgfile;
      }
      fprintf(local_140,"sh->num_ref_idx_l0_active_minus1: %d \n",
              (ulong)(uint)__s->num_ref_idx_l0_active_minus1);
      iVar6 = is_slice_type(__s->slice_type,1);
      if (iVar6 != 0) {
        if (h264_dbgfile == (FILE *)0x0) {
          local_148 = _stdout;
        }
        else {
          local_148 = (FILE *)h264_dbgfile;
        }
        fprintf(local_148,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar4 = bs_read_ue(b);
        __s->num_ref_idx_l1_active_minus1 = uVar4;
        if (h264_dbgfile == (FILE *)0x0) {
          local_150 = _stdout;
        }
        else {
          local_150 = (FILE *)h264_dbgfile;
        }
        fprintf(local_150,"sh->num_ref_idx_l1_active_minus1: %d \n",
                (ulong)(uint)__s->num_ref_idx_l1_active_minus1);
      }
    }
  }
  read_debug_ref_pic_list_reordering(h,b);
  if (((ppVar2->weighted_pred_flag != 0) &&
      ((iVar6 = is_slice_type(__s->slice_type,0), iVar6 != 0 ||
       (iVar6 = is_slice_type(__s->slice_type,3), iVar6 != 0)))) ||
     ((ppVar2->weighted_bipred_idc == 1 && (iVar6 = is_slice_type(__s->slice_type,1), iVar6 != 0))))
  {
    read_debug_pred_weight_table(h,b);
  }
  if (pnVar1->nal_ref_idc != 0) {
    read_debug_dec_ref_pic_marking(h,b);
  }
  if (((ppVar2->entropy_coding_mode_flag != 0) &&
      (iVar6 = is_slice_type(__s->slice_type,2), iVar6 == 0)) &&
     (iVar6 = is_slice_type(__s->slice_type,4), iVar6 == 0)) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_158 = _stdout;
    }
    else {
      local_158 = (FILE *)h264_dbgfile;
    }
    fprintf(local_158,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    __s->cabac_init_idc = uVar4;
    if (h264_dbgfile == (FILE *)0x0) {
      local_160 = _stdout;
    }
    else {
      local_160 = (FILE *)h264_dbgfile;
    }
    fprintf(local_160,"sh->cabac_init_idc: %d \n",(ulong)(uint)__s->cabac_init_idc);
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_168 = _stdout;
  }
  else {
    local_168 = (FILE *)h264_dbgfile;
  }
  fprintf(local_168,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  iVar5 = bs_read_se(b);
  __s->slice_qp_delta = iVar5;
  if (h264_dbgfile == (FILE *)0x0) {
    local_170 = _stdout;
  }
  else {
    local_170 = (FILE *)h264_dbgfile;
  }
  fprintf(local_170,"sh->slice_qp_delta: %d \n",(ulong)(uint)__s->slice_qp_delta);
  iVar6 = is_slice_type(__s->slice_type,3);
  if ((iVar6 != 0) || (iVar6 = is_slice_type(__s->slice_type,4), iVar6 != 0)) {
    iVar6 = is_slice_type(__s->slice_type,3);
    if (iVar6 != 0) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_178 = _stdout;
      }
      else {
        local_178 = (FILE *)h264_dbgfile;
      }
      fprintf(local_178,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar4 = bs_read_u1(b);
      __s->sp_for_switch_flag = uVar4;
      if (h264_dbgfile == (FILE *)0x0) {
        local_180 = _stdout;
      }
      else {
        local_180 = (FILE *)h264_dbgfile;
      }
      fprintf(local_180,"sh->sp_for_switch_flag: %d \n",(ulong)(uint)__s->sp_for_switch_flag);
    }
    if (h264_dbgfile == (FILE *)0x0) {
      local_188 = _stdout;
    }
    else {
      local_188 = (FILE *)h264_dbgfile;
    }
    fprintf(local_188,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    iVar5 = bs_read_se(b);
    __s->slice_qs_delta = iVar5;
    if (h264_dbgfile == (FILE *)0x0) {
      local_190 = _stdout;
    }
    else {
      local_190 = (FILE *)h264_dbgfile;
    }
    fprintf(local_190,"sh->slice_qs_delta: %d \n",(ulong)(uint)__s->slice_qs_delta);
  }
  if (ppVar2->deblocking_filter_control_present_flag != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_198 = _stdout;
    }
    else {
      local_198 = (FILE *)h264_dbgfile;
    }
    fprintf(local_198,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    __s->disable_deblocking_filter_idc = uVar4;
    if (h264_dbgfile == (FILE *)0x0) {
      local_1a0 = _stdout;
    }
    else {
      local_1a0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1a0,"sh->disable_deblocking_filter_idc: %d \n",
            (ulong)(uint)__s->disable_deblocking_filter_idc);
    if (__s->disable_deblocking_filter_idc != 1) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_1a8 = _stdout;
      }
      else {
        local_1a8 = (FILE *)h264_dbgfile;
      }
      fprintf(local_1a8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      iVar5 = bs_read_se(b);
      __s->slice_alpha_c0_offset_div2 = iVar5;
      if (h264_dbgfile == (FILE *)0x0) {
        local_1b0 = _stdout;
      }
      else {
        local_1b0 = (FILE *)h264_dbgfile;
      }
      fprintf(local_1b0,"sh->slice_alpha_c0_offset_div2: %d \n",
              (ulong)(uint)__s->slice_alpha_c0_offset_div2);
      if (h264_dbgfile == (FILE *)0x0) {
        local_1b8 = _stdout;
      }
      else {
        local_1b8 = (FILE *)h264_dbgfile;
      }
      fprintf(local_1b8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      iVar5 = bs_read_se(b);
      __s->slice_beta_offset_div2 = iVar5;
      if (h264_dbgfile == (FILE *)0x0) {
        local_1c0 = _stdout;
      }
      else {
        local_1c0 = (FILE *)h264_dbgfile;
      }
      fprintf(local_1c0,"sh->slice_beta_offset_div2: %d \n",(ulong)(uint)__s->slice_beta_offset_div2
             );
    }
  }
  if (((0 < ppVar2->num_slice_groups_minus1) && (2 < ppVar2->slice_group_map_type)) &&
     (ppVar2->slice_group_map_type < 6)) {
    iVar6 = intlog2(ppVar2->pic_size_in_map_units_minus1 + ppVar2->slice_group_change_rate_minus1 +
                    1);
    if (h264_dbgfile == (FILE *)0x0) {
      local_1c8 = _stdout;
    }
    else {
      local_1c8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1c8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_u(b,iVar6);
    __s->slice_group_change_cycle = uVar4;
    if (h264_dbgfile == (FILE *)0x0) {
      local_1d0 = _stdout;
    }
    else {
      local_1d0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1d0,"sh->slice_group_change_cycle: %d \n",
            (ulong)(uint)__s->slice_group_change_cycle);
  }
  return;
}

Assistant:

void read_debug_slice_header(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    if( 1 )
    {
        memset(sh, 0, sizeof(slice_header_t));
    }

    nal_t* nal = h->nal;

    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->first_mb_in_slice = bs_read_ue(b); printf("sh->first_mb_in_slice: %d \n", sh->first_mb_in_slice); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_type = bs_read_ue(b); printf("sh->slice_type: %d \n", sh->slice_type); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pic_parameter_set_id = bs_read_ue(b); printf("sh->pic_parameter_set_id: %d \n", sh->pic_parameter_set_id); 

    // TODO check existence, otherwise fail
    pps_t* pps = h->pps;
    sps_t* sps = h->sps;
    memcpy(h->pps, h->pps_table[sh->pic_parameter_set_id], sizeof(pps_t));
    memcpy(h->sps, h->sps_table[pps->seq_parameter_set_id], sizeof(sps_t));

    if (sps->residual_colour_transform_flag)
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->colour_plane_id = bs_read_u(b, 2); printf("sh->colour_plane_id: %d \n", sh->colour_plane_id); 
    }

    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->frame_num = bs_read_u(b, sps->log2_max_frame_num_minus4 + 4 ); printf("sh->frame_num: %d \n", sh->frame_num);  // was u(v)
    if( !sps->frame_mbs_only_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->field_pic_flag = bs_read_u1(b); printf("sh->field_pic_flag: %d \n", sh->field_pic_flag); 
        if( sh->field_pic_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->bottom_field_flag = bs_read_u1(b); printf("sh->bottom_field_flag: %d \n", sh->bottom_field_flag); 
        }
    }
    if( nal->nal_unit_type == 5 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->idr_pic_id = bs_read_ue(b); printf("sh->idr_pic_id: %d \n", sh->idr_pic_id); 
    }
    if( sps->pic_order_cnt_type == 0 )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pic_order_cnt_lsb = bs_read_u(b, sps->log2_max_pic_order_cnt_lsb_minus4 + 4 ); printf("sh->pic_order_cnt_lsb: %d \n", sh->pic_order_cnt_lsb);  // was u(v)
        if( pps->pic_order_present_flag && !sh->field_pic_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->delta_pic_order_cnt_bottom = bs_read_se(b); printf("sh->delta_pic_order_cnt_bottom: %d \n", sh->delta_pic_order_cnt_bottom); 
        }
    }
    if( sps->pic_order_cnt_type == 1 && !sps->delta_pic_order_always_zero_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->delta_pic_order_cnt[ 0 ] = bs_read_se(b); printf("sh->delta_pic_order_cnt[ 0 ]: %d \n", sh->delta_pic_order_cnt[ 0 ]); 
        if( pps->pic_order_present_flag && !sh->field_pic_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->delta_pic_order_cnt[ 1 ] = bs_read_se(b); printf("sh->delta_pic_order_cnt[ 1 ]: %d \n", sh->delta_pic_order_cnt[ 1 ]); 
        }
    }
    if( pps->redundant_pic_cnt_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->redundant_pic_cnt = bs_read_ue(b); printf("sh->redundant_pic_cnt: %d \n", sh->redundant_pic_cnt); 
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->direct_spatial_mv_pred_flag = bs_read_u1(b); printf("sh->direct_spatial_mv_pred_flag: %d \n", sh->direct_spatial_mv_pred_flag); 
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_P ) || is_slice_type( sh->slice_type, SH_SLICE_TYPE_SP ) || is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->num_ref_idx_active_override_flag = bs_read_u1(b); printf("sh->num_ref_idx_active_override_flag: %d \n", sh->num_ref_idx_active_override_flag); 
        if( sh->num_ref_idx_active_override_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->num_ref_idx_l0_active_minus1 = bs_read_ue(b); printf("sh->num_ref_idx_l0_active_minus1: %d \n", sh->num_ref_idx_l0_active_minus1);  // FIXME does this modify the pps?
            if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->num_ref_idx_l1_active_minus1 = bs_read_ue(b); printf("sh->num_ref_idx_l1_active_minus1: %d \n", sh->num_ref_idx_l1_active_minus1); 
            }
        }
    }
    read_debug_ref_pic_list_reordering(h, b);
    if( ( pps->weighted_pred_flag && ( is_slice_type( sh->slice_type, SH_SLICE_TYPE_P ) || is_slice_type( sh->slice_type, SH_SLICE_TYPE_SP ) ) ) ||
        ( pps->weighted_bipred_idc == 1 && is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) ) )
    {
        read_debug_pred_weight_table(h, b);
    }
    if( nal->nal_ref_idc != 0 )
    {
        read_debug_dec_ref_pic_marking(h, b);
    }
    if( pps->entropy_coding_mode_flag && ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_I ) && ! is_slice_type( sh->slice_type, SH_SLICE_TYPE_SI ) )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->cabac_init_idc = bs_read_ue(b); printf("sh->cabac_init_idc: %d \n", sh->cabac_init_idc); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_qp_delta = bs_read_se(b); printf("sh->slice_qp_delta: %d \n", sh->slice_qp_delta); 
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_SP ) || is_slice_type( sh->slice_type, SH_SLICE_TYPE_SI ) )
    {
        if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_SP ) )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->sp_for_switch_flag = bs_read_u1(b); printf("sh->sp_for_switch_flag: %d \n", sh->sp_for_switch_flag); 
        }
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_qs_delta = bs_read_se(b); printf("sh->slice_qs_delta: %d \n", sh->slice_qs_delta); 
    }
    if( pps->deblocking_filter_control_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->disable_deblocking_filter_idc = bs_read_ue(b); printf("sh->disable_deblocking_filter_idc: %d \n", sh->disable_deblocking_filter_idc); 
        if( sh->disable_deblocking_filter_idc != 1 )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_alpha_c0_offset_div2 = bs_read_se(b); printf("sh->slice_alpha_c0_offset_div2: %d \n", sh->slice_alpha_c0_offset_div2); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_beta_offset_div2 = bs_read_se(b); printf("sh->slice_beta_offset_div2: %d \n", sh->slice_beta_offset_div2); 
        }
    }
    if( pps->num_slice_groups_minus1 > 0 &&
        pps->slice_group_map_type >= 3 && pps->slice_group_map_type <= 5)
    {
        int v = intlog2( pps->pic_size_in_map_units_minus1 +  pps->slice_group_change_rate_minus1 + 1 );
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->slice_group_change_cycle = bs_read_u(b, v); printf("sh->slice_group_change_cycle: %d \n", sh->slice_group_change_cycle);  // FIXME add 2?
    }
}